

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::ComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeTestInstance *this)

{
  VkAccessFlags *pVVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  undefined8 commandBuffer;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Allocation *pAVar5;
  bool bVar6;
  deUint32 queueFamilyIndex;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  const_iterator cVar7;
  VkSpecializationInfo *specInfo;
  VkBufferMemoryBarrier shaderWriteBarrier;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  Specialization specialization;
  pointer local_148;
  pointer pGStack_140;
  pointer local_138;
  pointer pVStack_130;
  VkQueue local_120;
  VkDescriptorSetLayout local_118;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_110;
  VkCommandPool local_f8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_f0;
  VkPipeline local_d8;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_d0;
  VkShaderModule local_b8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_b0;
  VkDescriptorPool local_98;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_90;
  Buffer resultBuffer;
  VkDescriptorBufferInfo descriptorBufferInfo;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_120 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)&specialization,this->m_ssboSize,0x20);
  pipeline::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&specialization,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&specialization);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&specialization,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&shaderWriteBarrier,this_01,vk,device,0);
  DStack_110.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_110.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_118.m_internal = shaderWriteBarrier._0_8_;
  DStack_110.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  if (specialization.m_specialization._0_8_ != 0) {
    operator_delete((void *)specialization.m_specialization._0_8_,
                    specialization.m_specialization.dataSize - specialization.m_specialization._0_8_
                   );
  }
  if (specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(specialization.m_entries.
                    super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)specialization.m_entries.
                          super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)specialization.m_entries.
                          super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (specialization.m_data.
      super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(specialization.m_data.
                    super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)specialization.m_data.
                          super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)specialization.m_data.
                          super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&shaderWriteBarrier);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&shaderWriteBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&specialization,this_02,vk,device,1,1);
  DStack_90.m_device =
       (VkDevice)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  DStack_90.m_allocator =
       (VkAllocationCallbacks *)
       specialization.m_entries.
       super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98.m_internal =
       (deUint64)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_start;
  DStack_90.m_deviceIface =
       (DeviceInterface *)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specialization.m_entries.
  super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (shaderWriteBarrier._0_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._0_8_,
                    shaderWriteBarrier._16_8_ - shaderWriteBarrier._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&specialization,vk,device,local_98,
                    local_118);
  local_138 = specialization.m_data.
              super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pVStack_130 = specialization.m_entries.
                super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_148 = specialization.m_data.
              super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pGStack_140 = specialization.m_data.
                super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&specialization);
  this_03 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&specialization,(int)local_148,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,vk,device);
  if (specialization.m_specialization._0_8_ != 0) {
    operator_delete((void *)specialization.m_specialization._0_8_,
                    specialization.m_specialization.dataSize - specialization.m_specialization._0_8_
                   );
  }
  if (specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(specialization.m_entries.
                    super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)specialization.m_entries.
                          super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)specialization.m_entries.
                          super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&specialization);
  Specialization::Specialization(&specialization,&this->m_specConstants);
  specInfo = (VkSpecializationInfo *)0x0;
  if (specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    specInfo = &specialization.m_specialization;
  }
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  local_1c8._0_8_ = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"comp","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(this_00,(key_type *)local_1c8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&shaderWriteBarrier,vk,device,
             *(ProgramBinary **)(cVar7._M_node + 2),0);
  DStack_b0.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_b0.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_b8.m_internal = shaderWriteBarrier._0_8_;
  DStack_b0.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier,vk,device,
                     local_118);
  local_1b8._M_allocated_capacity._0_4_ = shaderWriteBarrier.srcAccessMask;
  local_1b8._M_allocated_capacity._4_4_ = shaderWriteBarrier.dstAccessMask;
  local_1b8._8_4_ = shaderWriteBarrier.srcQueueFamilyIndex;
  local_1b8._12_4_ = shaderWriteBarrier.dstQueueFamilyIndex;
  local_1c8._0_8_ = shaderWriteBarrier._0_8_;
  local_1c8._8_8_ = shaderWriteBarrier.pNext;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&shaderWriteBarrier,vk,device,
                      (VkPipelineLayout)shaderWriteBarrier._0_8_,local_b8,specInfo);
  DStack_d0.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_d0.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_d8.m_internal = shaderWriteBarrier._0_8_;
  DStack_d0.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier,vk,device,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  DStack_f0.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_f0.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_f8.m_internal = shaderWriteBarrier._0_8_;
  DStack_f0.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier,vk,device,
                    (VkCommandPool)shaderWriteBarrier._0_8_);
  uVar4 = shaderWriteBarrier._24_8_;
  uVar3 = shaderWriteBarrier._16_8_;
  pvVar2 = shaderWriteBarrier.pNext;
  commandBuffer = shaderWriteBarrier._0_8_;
  beginCommandBuffer(vk,(VkCommandBuffer)shaderWriteBarrier._0_8_);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,1,local_d8.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,1,local_1c8._0_8_,0,1,&local_148,0,0);
  (*vk->_vptr_DeviceInterface[0x5d])(vk,commandBuffer,1,1);
  makeBufferMemoryBarrier
            (&shaderWriteBarrier,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,this->m_ssboSize);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x800,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineSpecConstantTests.cpp"
                    ,0x207);
  submitCommandsAndWait(vk,device,local_120,(VkCommandBuffer)commandBuffer);
  pAVar5 = resultBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,this->m_ssboSize);
  bVar6 = verifyValues(((this->super_TestInstance).m_context)->m_testCtx->m_log,pAVar5->m_hostPtr,
                       &this->m_expectedValues);
  pVVar1 = &shaderWriteBarrier.srcAccessMask;
  shaderWriteBarrier._0_8_ = pVVar1;
  if (bVar6) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&shaderWriteBarrier,"Success","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,shaderWriteBarrier._0_8_,
               (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&shaderWriteBarrier,"Values did not match","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,shaderWriteBarrier._0_8_,
               (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  }
  if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != pVVar1) {
    operator_delete((void *)shaderWriteBarrier._0_8_,shaderWriteBarrier._16_8_ + 1);
  }
  if (commandBuffer != 0) {
    shaderWriteBarrier._0_8_ = commandBuffer;
    (**(code **)(*pvVar2 + 0x240))(pvVar2,uVar3,uVar4,1);
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_f0,local_f8);
  }
  if (local_d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_d0,local_d8);
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_1c8 + 8),
               (VkPipelineLayout)local_1c8._0_8_);
  }
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_b0,local_b8);
  }
  if (specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(specialization.m_entries.
                    super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)specialization.m_entries.
                          super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)specialization.m_entries.
                          super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (specialization.m_data.
      super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(specialization.m_data.
                    super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)specialization.m_data.
                          super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)specialization.m_data.
                          super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148 != (pointer)0x0) {
    specialization.m_data.
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
    ._M_impl.super__Vector_impl_data._M_start = local_148;
    (**(code **)(pGStack_140->m_data + 0x1e8))(pGStack_140,local_138,pVStack_130,1);
  }
  if (local_98.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_90,local_98);
  }
  if (local_118.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_110,local_118);
  }
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ComputeTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Descriptors

	const Buffer resultBuffer(vk, device, allocator, makeBufferCreateInfo(m_ssboSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet        (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  descriptorBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, m_ssboSize);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorBufferInfo)
		.update(vk, device);

	// Specialization

	const Specialization        specialization (m_specConstants);
	const VkSpecializationInfo* pSpecInfo      = specialization.getSpecializationInfo();

	// Pipeline

	const Unique<VkShaderModule>   shaderModule  (createShaderModule (vk, device, m_context.getBinaryCollection().get("comp"), 0));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout (vk, device, *descriptorSetLayout));
	const Unique<VkPipeline>       pipeline      (makeComputePipeline(vk, device, *pipelineLayout, *shaderModule, pSpecInfo));
	const Unique<VkCommandPool>    cmdPool       (createCommandPool  (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (makeCommandBuffer  (vk, device, *cmdPool));

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, 1u, 1u, 1u);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, m_ssboSize);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_ssboSize);

	if (verifyValues(m_context.getTestContext().getLog(), resultAlloc.getHostPtr(), m_expectedValues))
		return tcu::TestStatus::pass("Success");
	else
		return tcu::TestStatus::fail("Values did not match");
}